

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O1

void __thiscall tst_GenericModel::moveRowsFromBranchToRoot(tst_GenericModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  QAbstractItemModelTester *this_00;
  long lVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  anon_union_24_3_e3d07ef4_for_data local_f0;
  anon_union_24_3_e3d07ef4_for_data local_d8;
  undefined8 local_c0;
  QString local_b8;
  GenericModel testModel;
  QArrayData *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  QModelIndex parIndex;
  QArrayData *local_58;
  char16_t *local_50;
  undefined8 local_48;
  ModelTest probe;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  this_00 = &probe.super_QAbstractItemModelTester;
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&testModel,QtTest,(QObject *)0x0);
  probe._0_8_ = &PTR_metaObject_001659f8;
  local_d8._forAlignment = -NAN;
  local_d8._8_8_ = 0;
  local_d8._16_8_ = 0;
  fillTable((tst_GenericModel *)this_00,(QAbstractItemModel *)&testModel,5,3,
            (QModelIndex *)&local_d8,0);
  local_d8._forAlignment = -NAN;
  local_d8._8_8_ = 0;
  local_d8._16_8_ = 0;
  GenericModel::index((int)&parIndex,(int)&testModel,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x4);
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x5);
  uVar5 = 0;
  while( true ) {
    iVar3 = GenericModel::rowCount((QModelIndex *)&testModel);
    if ((long)iVar3 <= (long)uVar5) break;
    lVar6 = 0;
    while( true ) {
      iVar3 = GenericModel::columnCount((QModelIndex *)&testModel);
      if (iVar3 <= lVar6) break;
      GenericModel::index((int)&local_f0,(int)(QModelIndex *)&testModel,
                          (QModelIndex *)(uVar5 & 0xffffffff));
      local_58 = (QArrayData *)0x0;
      local_50 = L"r%1,c%2";
      local_48 = 7;
      QString::arg((longlong)&local_88,(int)&local_58,(int)uVar5,(QChar)0x0);
      QString::arg((longlong)&local_b8,(int)&local_88,(int)lVar6,(QChar)0x0);
      QVariant::QVariant((QVariant *)&local_d8,&local_b8);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_f0,(int)&local_d8);
      QVariant::~QVariant((QVariant *)&local_d8);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,8);
        }
      }
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,8);
        }
      }
      lVar6 = lVar6 + 1;
    }
    uVar5 = uVar5 + 1;
  }
  local_d8._forAlignment = -NAN;
  local_d8._8_8_ = 0;
  local_d8._16_8_ = 0;
  bVar1 = (bool)GenericModel::moveRows
                          ((QModelIndex *)&testModel,(int)&parIndex,1,(QModelIndex *)0x2,
                           (int)&local_d8);
  cVar2 = QTest::qVerify(bVar1,"testModel.moveRows(parIndex, 1, 2, QModelIndex(), 0)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7c3);
  if (cVar2 != '\0') {
    iVar3 = GenericModel::rowCount((QModelIndex *)&testModel);
    cVar2 = QTest::qCompare(iVar3,3,"testModel.rowCount(parIndex)","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7c4);
    if (cVar2 != '\0') {
      iVar3 = GenericModel::columnCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar3,4,"testModel.columnCount(parIndex)","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7c5);
      if (cVar2 != '\0') {
        local_d8._forAlignment = -NAN;
        local_d8._8_8_ = 0;
        local_d8._16_8_ = 0;
        iVar3 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar2 = QTest::qCompare(iVar3,7,"testModel.rowCount()","7",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x7c6);
        if (cVar2 != '\0') {
          local_d8._forAlignment = -NAN;
          local_d8._8_8_ = 0;
          local_d8._16_8_ = 0;
          iVar3 = GenericModel::columnCount((QModelIndex *)&testModel);
          cVar2 = QTest::qCompare(iVar3,4,"testModel.columnCount()","4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x7c7);
          if (cVar2 != '\0') {
            local_88 = (QArrayData *)0xffffffffffffffff;
            local_80 = 0;
            uStack_78 = 0;
            GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x0);
            if ((long *)local_b8.d.size == (long *)0x0) {
              local_d8.shared = (PrivateShared *)0x0;
              local_d8._8_8_ = 0;
              local_d8._16_8_ = 0;
              local_c0 = 2;
            }
            else {
              (**(code **)(*(long *)local_b8.d.size + 0x90))(&local_d8,local_b8.d.size,&local_b8,0);
            }
            QVariant::toString();
            QVar7.m_data = (storage_type_conflict *)local_f0._8_8_;
            QVar7.m_size = local_f0._16_8_;
            QVar19.m_data = L"r1,c0";
            QVar19.m_size = 5;
            cVar2 = QTest::qCompare(QVar7,QVar19,"testModel.index(0, 0).data().toString()",
                                    "QStringLiteral(\"r1,c0\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x7c8);
            if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
              UNLOCK();
              if (*(int *)local_f0.shared == 0) {
                QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
              }
            }
            QVariant::~QVariant((QVariant *)&local_d8);
            if (cVar2 != '\0') {
              local_88 = (QArrayData *)0xffffffffffffffff;
              local_80 = 0;
              uStack_78 = 0;
              GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x1);
              if ((long *)local_b8.d.size == (long *)0x0) {
                local_d8.shared = (PrivateShared *)0x0;
                local_d8._8_8_ = 0;
                local_d8._16_8_ = 0;
                local_c0 = 2;
              }
              else {
                (**(code **)(*(long *)local_b8.d.size + 0x90))
                          (&local_d8,local_b8.d.size,&local_b8,0);
              }
              QVariant::toString();
              QVar8.m_data = (storage_type_conflict *)local_f0._8_8_;
              QVar8.m_size = local_f0._16_8_;
              QVar20.m_data = L"r2,c0";
              QVar20.m_size = 5;
              cVar2 = QTest::qCompare(QVar8,QVar20,"testModel.index(1, 0).data().toString()",
                                      "QStringLiteral(\"r2,c0\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x7c9);
              if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                LOCK();
                *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                UNLOCK();
                if (*(int *)local_f0.shared == 0) {
                  QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                }
              }
              QVariant::~QVariant((QVariant *)&local_d8);
              if (cVar2 != '\0') {
                local_88 = (QArrayData *)0xffffffffffffffff;
                local_80 = 0;
                uStack_78 = 0;
                GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x0);
                if ((long *)local_b8.d.size == (long *)0x0) {
                  local_d8.shared = (PrivateShared *)0x0;
                  local_d8._8_8_ = 0;
                  local_d8._16_8_ = 0;
                  local_c0 = 2;
                }
                else {
                  (**(code **)(*(long *)local_b8.d.size + 0x90))
                            (&local_d8,local_b8.d.size,&local_b8,0);
                }
                QVariant::toString();
                QVar9.m_data = (storage_type_conflict *)local_f0._8_8_;
                QVar9.m_size = local_f0._16_8_;
                QVar21.m_data = L"r1,c3";
                QVar21.m_size = 5;
                cVar2 = QTest::qCompare(QVar9,QVar21,"testModel.index(0, 3).data().toString()",
                                        "QStringLiteral(\"r1,c3\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x7ca);
                if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                  UNLOCK();
                  if (*(int *)local_f0.shared == 0) {
                    QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                  }
                }
                QVariant::~QVariant((QVariant *)&local_d8);
                if (cVar2 != '\0') {
                  local_88 = (QArrayData *)0xffffffffffffffff;
                  local_80 = 0;
                  uStack_78 = 0;
                  GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x1);
                  if ((long *)local_b8.d.size == (long *)0x0) {
                    local_d8.shared = (PrivateShared *)0x0;
                    local_d8._8_8_ = 0;
                    local_d8._16_8_ = 0;
                    local_c0 = 2;
                  }
                  else {
                    (**(code **)(*(long *)local_b8.d.size + 0x90))
                              (&local_d8,local_b8.d.size,&local_b8,0);
                  }
                  QVariant::toString();
                  QVar10.m_data = (storage_type_conflict *)local_f0._8_8_;
                  QVar10.m_size = local_f0._16_8_;
                  QVar22.m_data = L"r2,c3";
                  QVar22.m_size = 5;
                  cVar2 = QTest::qCompare(QVar10,QVar22,"testModel.index(1, 3).data().toString()",
                                          "QStringLiteral(\"r2,c3\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x7cb);
                  if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                    LOCK();
                    *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                    UNLOCK();
                    if (*(int *)local_f0.shared == 0) {
                      QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                    }
                  }
                  QVariant::~QVariant((QVariant *)&local_d8);
                  if (cVar2 != '\0') {
                    local_88 = (QArrayData *)0xffffffffffffffff;
                    local_80 = 0;
                    uStack_78 = 0;
                    GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x2);
                    if ((long *)local_b8.d.size == (long *)0x0) {
                      local_d8.shared = (PrivateShared *)0x0;
                      local_d8._8_8_ = 0;
                      local_d8._16_8_ = 0;
                      local_c0 = 2;
                    }
                    else {
                      (**(code **)(*(long *)local_b8.d.size + 0x90))
                                (&local_d8,local_b8.d.size,&local_b8,0);
                    }
                    QVariant::toString();
                    QVar11.m_data = (storage_type_conflict *)local_f0._8_8_;
                    QVar11.m_size = local_f0._16_8_;
                    QVar23.m_data = L"0,0";
                    QVar23.m_size = 3;
                    cVar2 = QTest::qCompare(QVar11,QVar23,"testModel.index(2, 0).data().toString()",
                                            "QStringLiteral(\"0,0\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x7cc);
                    if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                      UNLOCK();
                      if (*(int *)local_f0.shared == 0) {
                        QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                      }
                    }
                    QVariant::~QVariant((QVariant *)&local_d8);
                    if (cVar2 != '\0') {
                      local_88 = (QArrayData *)0xffffffffffffffff;
                      local_80 = 0;
                      uStack_78 = 0;
                      GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x3);
                      if ((long *)local_b8.d.size == (long *)0x0) {
                        local_d8.shared = (PrivateShared *)0x0;
                        local_d8._8_8_ = 0;
                        local_d8._16_8_ = 0;
                        local_c0 = 2;
                      }
                      else {
                        (**(code **)(*(long *)local_b8.d.size + 0x90))
                                  (&local_d8,local_b8.d.size,&local_b8,0);
                      }
                      QVariant::toString();
                      QVar12.m_data = (storage_type_conflict *)local_f0._8_8_;
                      QVar12.m_size = local_f0._16_8_;
                      QVar24.m_data = L"1,0";
                      QVar24.m_size = 3;
                      cVar2 = QTest::qCompare(QVar12,QVar24,
                                              "testModel.index(3, 0).data().toString()",
                                              "QStringLiteral(\"1,0\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x7cd);
                      if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                        LOCK();
                        *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                        UNLOCK();
                        if (*(int *)local_f0.shared == 0) {
                          QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                        }
                      }
                      QVariant::~QVariant((QVariant *)&local_d8);
                      if (cVar2 != '\0') {
                        local_88 = (QArrayData *)0xffffffffffffffff;
                        local_80 = 0;
                        uStack_78 = 0;
                        GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x4);
                        if ((long *)local_b8.d.size == (long *)0x0) {
                          local_d8.shared = (PrivateShared *)0x0;
                          local_d8._8_8_ = 0;
                          local_d8._16_8_ = 0;
                          local_c0 = 2;
                        }
                        else {
                          (**(code **)(*(long *)local_b8.d.size + 0x90))
                                    (&local_d8,local_b8.d.size,&local_b8,0);
                        }
                        QVariant::toString();
                        QVar13.m_data = (storage_type_conflict *)local_f0._8_8_;
                        QVar13.m_size = local_f0._16_8_;
                        QVar25.m_data = L"2,0";
                        QVar25.m_size = 3;
                        cVar2 = QTest::qCompare(QVar13,QVar25,
                                                "testModel.index(4, 0).data().toString()",
                                                "QStringLiteral(\"2,0\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x7ce);
                        if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                          LOCK();
                          *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                          UNLOCK();
                          if (*(int *)local_f0.shared == 0) {
                            QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                          }
                        }
                        QVariant::~QVariant((QVariant *)&local_d8);
                        if (cVar2 != '\0') {
                          local_88 = (QArrayData *)0xffffffffffffffff;
                          local_80 = 0;
                          uStack_78 = 0;
                          GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x5);
                          if ((long *)local_b8.d.size == (long *)0x0) {
                            local_d8.shared = (PrivateShared *)0x0;
                            local_d8._8_8_ = 0;
                            local_d8._16_8_ = 0;
                            local_c0 = 2;
                          }
                          else {
                            (**(code **)(*(long *)local_b8.d.size + 0x90))
                                      (&local_d8,local_b8.d.size,&local_b8,0);
                          }
                          QVariant::toString();
                          QVar14.m_data = (storage_type_conflict *)local_f0._8_8_;
                          QVar14.m_size = local_f0._16_8_;
                          QVar26.m_data = L"3,0";
                          QVar26.m_size = 3;
                          cVar2 = QTest::qCompare(QVar14,QVar26,
                                                  "testModel.index(5, 0).data().toString()",
                                                  "QStringLiteral(\"3,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,1999);
                          if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                            LOCK();
                            *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                            UNLOCK();
                            if (*(int *)local_f0.shared == 0) {
                              QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                            }
                          }
                          QVariant::~QVariant((QVariant *)&local_d8);
                          if (cVar2 != '\0') {
                            local_88 = (QArrayData *)0xffffffffffffffff;
                            local_80 = 0;
                            uStack_78 = 0;
                            GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x6);
                            if ((long *)local_b8.d.size == (long *)0x0) {
                              local_d8.shared = (PrivateShared *)0x0;
                              local_d8._8_8_ = 0;
                              local_d8._16_8_ = 0;
                              local_c0 = 2;
                            }
                            else {
                              (**(code **)(*(long *)local_b8.d.size + 0x90))
                                        (&local_d8,local_b8.d.size,&local_b8,0);
                            }
                            QVariant::toString();
                            QVar15.m_data = (storage_type_conflict *)local_f0._8_8_;
                            QVar15.m_size = local_f0._16_8_;
                            QVar27.m_data = L"4,0";
                            QVar27.m_size = 3;
                            cVar2 = QTest::qCompare(QVar15,QVar27,
                                                    "testModel.index(6, 0).data().toString()",
                                                    "QStringLiteral(\"4,0\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,2000);
                            if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                              LOCK();
                              *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                              UNLOCK();
                              if (*(int *)local_f0.shared == 0) {
                                QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                              }
                            }
                            QVariant::~QVariant((QVariant *)&local_d8);
                            if (cVar2 != '\0') {
                              iVar3 = 2;
                              do {
                                GenericModel::headerData
                                          ((int)&local_d8,(Orientation)&testModel,iVar3);
                                iVar4 = QVariant::toInt((bool *)local_d8.data);
                                cVar2 = QTest::qCompare(iVar4,iVar3 + -2,
                                                                                                                
                                                  "testModel.headerData(i, Qt::Vertical).toInt()",
                                                  "i - 2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d2);
                                QVariant::~QVariant((QVariant *)&local_d8);
                                if (cVar2 == '\0') goto LAB_0012a9e5;
                                iVar3 = iVar3 + 1;
                              } while (iVar3 != 7);
                              GenericModel::index((int)&local_b8,(int)&testModel,(QModelIndex *)0x0)
                              ;
                              if ((long *)local_b8.d.size == (long *)0x0) {
                                local_d8.shared = (PrivateShared *)0x0;
                                local_d8._8_8_ = 0;
                                local_d8._16_8_ = 0;
                                local_c0 = 2;
                              }
                              else {
                                (**(code **)(*(long *)local_b8.d.size + 0x90))
                                          (&local_d8,local_b8.d.size,&local_b8,0);
                              }
                              QVariant::toString();
                              QVar16.m_data = (storage_type_conflict *)local_f0._8_8_;
                              QVar16.m_size = local_f0._16_8_;
                              QVar28.m_data = L"r0,c0";
                              QVar28.m_size = 5;
                              cVar2 = QTest::qCompare(QVar16,QVar28,
                                                                                                            
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r0,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d3);
                              if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                                LOCK();
                                *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                                UNLOCK();
                                if (*(int *)local_f0.shared == 0) {
                                  QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                                }
                              }
                              QVariant::~QVariant((QVariant *)&local_d8);
                              if (cVar2 != '\0') {
                                GenericModel::index((int)&local_b8,(int)&testModel,
                                                    (QModelIndex *)0x1);
                                if ((long *)local_b8.d.size == (long *)0x0) {
                                  local_d8.shared = (PrivateShared *)0x0;
                                  local_d8._8_8_ = 0;
                                  local_d8._16_8_ = 0;
                                  local_c0 = 2;
                                }
                                else {
                                  (**(code **)(*(long *)local_b8.d.size + 0x90))
                                            (&local_d8,local_b8.d.size,&local_b8,0);
                                }
                                QVariant::toString();
                                QVar17.m_data = (storage_type_conflict *)local_f0._8_8_;
                                QVar17.m_size = local_f0._16_8_;
                                QVar29.m_data = L"r3,c0";
                                QVar29.m_size = 5;
                                cVar2 = QTest::qCompare(QVar17,QVar29,
                                                                                                                
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r3,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d4);
                                if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                                  LOCK();
                                  *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                                  UNLOCK();
                                  if (*(int *)local_f0.shared == 0) {
                                    QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                                  }
                                }
                                QVariant::~QVariant((QVariant *)&local_d8);
                                if (cVar2 != '\0') {
                                  GenericModel::index((int)&local_b8,(int)&testModel,
                                                      (QModelIndex *)0x2);
                                  if ((long *)local_b8.d.size == (long *)0x0) {
                                    local_d8.shared = (PrivateShared *)0x0;
                                    local_d8._8_8_ = 0;
                                    local_d8._16_8_ = 0;
                                    local_c0 = 2;
                                  }
                                  else {
                                    (**(code **)(*(long *)local_b8.d.size + 0x90))
                                              (&local_d8,local_b8.d.size,&local_b8,0);
                                  }
                                  QVariant::toString();
                                  QVar18.m_data = (storage_type_conflict *)local_f0._8_8_;
                                  QVar18.m_size = local_f0._16_8_;
                                  QVar30.m_data = L"r4,c0";
                                  QVar30.m_size = 5;
                                  QTest::qCompare(QVar18,QVar30,
                                                  "testModel.index(2, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r4,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d5);
                                  if ((QArrayData *)local_f0.shared != (QArrayData *)0x0) {
                                    LOCK();
                                    *(int *)local_f0.shared = *(int *)local_f0.shared + -1;
                                    UNLOCK();
                                    if (*(int *)local_f0.shared == 0) {
                                      QArrayData::deallocate((QArrayData *)local_f0.shared,2,8);
                                    }
                                  }
                                  QVariant::~QVariant((QVariant *)&local_d8);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012a9e5:
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveRowsFromBranchToRoot()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 5, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 4, parIndex);
    testModel.insertRows(0, 5, parIndex);
    for (int r = 0; r < testModel.rowCount(parIndex); ++r) {
        for (int c = 0; c < testModel.columnCount(parIndex); ++c)
            testModel.setData(testModel.index(r, c, parIndex), QStringLiteral("r%1,c%2").arg(r).arg(c));
    }

    QVERIFY(testModel.moveRows(parIndex, 1, 2, QModelIndex(), 0));
    QCOMPARE(testModel.rowCount(parIndex), 3);
    QCOMPARE(testModel.columnCount(parIndex), 4);
    QCOMPARE(testModel.rowCount(), 7);
    QCOMPARE(testModel.columnCount(), 4);
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("r1,c0"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("r2,c0"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("r1,c3"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("r2,c3"));
    QCOMPARE(testModel.index(2, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(3, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(4, 0).data().toString(), QStringLiteral("2,0"));
    QCOMPARE(testModel.index(5, 0).data().toString(), QStringLiteral("3,0"));
    QCOMPARE(testModel.index(6, 0).data().toString(), QStringLiteral("4,0"));
    for (int i = 2; i < 7; ++i)
        QCOMPARE(testModel.headerData(i, Qt::Vertical).toInt(), i - 2);
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("r0,c0"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("r3,c0"));
    QCOMPARE(testModel.index(2, 0, parIndex).data().toString(), QStringLiteral("r4,c0"));
}